

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

Imputer * __thiscall CoreML::Specification::Model::mutable_imputer(Model *this)

{
  Imputer *this_00;
  
  if (this->_oneof_case_[0] == 0x259) {
    this_00 = (Imputer *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x259;
    this_00 = (Imputer *)operator_new(0x30);
    Imputer::Imputer(this_00);
    (this->Type_).imputer_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Imputer* Model::mutable_imputer() {
  if (!has_imputer()) {
    clear_Type();
    set_has_imputer();
    Type_.imputer_ = new ::CoreML::Specification::Imputer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.imputer)
  return Type_.imputer_;
}